

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void PathBezierQuadraticCurveToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float tess_tol,int level)

{
  float x2_00;
  float y2_00;
  float x2_01;
  float y2_01;
  float x3_00;
  float y3_00;
  float y123;
  float x123;
  float y23;
  float x23;
  float y12;
  float x12;
  float local_3c;
  float local_38;
  float det;
  float dy;
  float dx;
  int level_local;
  float tess_tol_local;
  float y3_local;
  float x3_local;
  float y2_local;
  float x2_local;
  float y1_local;
  float x1_local;
  ImVector<ImVec2> *path_local;
  
  det = x3 - x1;
  local_38 = y3 - y1;
  local_3c = (x2 - x3) * local_38 + -((y2 - y3) * det);
  dy = (float)level;
  dx = tess_tol;
  level_local = (int)y3;
  tess_tol_local = x3;
  y3_local = y2;
  x3_local = x2;
  y2_local = y1;
  x2_local = x1;
  _y1_local = path;
  if (tess_tol * (det * det + local_38 * local_38) <= local_3c * local_3c * 4.0) {
    if (level < 10) {
      x2_00 = (x1 + x2) * 0.5;
      y2_00 = (y1 + y2) * 0.5;
      x2_01 = (x2 + x3) * 0.5;
      y2_01 = (y2 + y3) * 0.5;
      x3_00 = (x2_00 + x2_01) * 0.5;
      y3_00 = (y2_00 + y2_01) * 0.5;
      PathBezierQuadraticCurveToCasteljau(path,x1,y1,x2_00,y2_00,x3_00,y3_00,tess_tol,level + 1);
      PathBezierQuadraticCurveToCasteljau
                (_y1_local,x3_00,y3_00,x2_01,y2_01,tess_tol_local,(float)level_local,dx,(int)dy + 1)
      ;
    }
  }
  else {
    ImVec2::ImVec2((ImVec2 *)&y12,x3,y3);
    ImVector<ImVec2>::push_back(path,(ImVec2 *)&y12);
  }
  return;
}

Assistant:

static void PathBezierQuadraticCurveToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float tess_tol, int level)
{
    float dx = x3 - x1, dy = y3 - y1;
    float det = (x2 - x3) * dy - (y2 - y3) * dx;
    if (det * det * 4.0f < tess_tol * (dx * dx + dy * dy))
    {
        path->push_back(ImVec2(x3, y3));
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2) * 0.5f, y12 = (y1 + y2) * 0.5f;
        float x23 = (x2 + x3) * 0.5f, y23 = (y2 + y3) * 0.5f;
        float x123 = (x12 + x23) * 0.5f, y123 = (y12 + y23) * 0.5f;
        PathBezierQuadraticCurveToCasteljau(path, x1, y1, x12, y12, x123, y123, tess_tol, level + 1);
        PathBezierQuadraticCurveToCasteljau(path, x123, y123, x23, y23, x3, y3, tess_tol, level + 1);
    }
}